

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpScanner.cpp
# Opt level: O1

int __thiscall glslang::TPpContext::lFloatConst(TPpContext *this,int len,int ch,TPpToken *ppToken)

{
  istringstream *piVar1;
  EShSource EVar2;
  TParseContextBase *pTVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar11;
  longlong lVar12;
  size_t sVar13;
  char *pcVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  char cVar20;
  bool bVar21;
  double expFactor;
  double dVar22;
  undefined4 uVar24;
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  double dVar26;
  TString numstr;
  int local_a4;
  int local_8c;
  int local_88;
  allocator<char> local_81;
  TPoolAllocator *local_80;
  char *local_78;
  long local_70;
  char local_68 [16];
  TPpContext *local_58;
  long *local_50 [2];
  long local_40 [2];
  ulong uVar10;
  
  if (len < 1) {
    uVar10 = 0;
  }
  else {
    uVar9 = 0;
    do {
      uVar10 = uVar9;
      if (ppToken->name[uVar9] != '0') break;
      uVar9 = uVar9 + 1;
      uVar10 = (ulong)(uint)len;
    } while ((uint)len != uVar9);
  }
  lVar15 = (long)len;
  uVar8 = (uint)uVar10;
  uVar7 = len;
  if ((int)uVar8 < len) {
    uVar7 = uVar8;
  }
  uVar16 = len + 1;
  do {
    uVar17 = uVar7;
    if (lVar15 <= (int)uVar8) break;
    uVar16 = uVar16 - 1;
    lVar11 = lVar15 + -1;
    lVar15 = lVar15 + -1;
    uVar17 = uVar16;
  } while (ppToken->name[lVar11] == '0');
  local_88 = uVar17 - uVar8;
  bVar6 = local_88 < 0x10;
  if (local_88 < 0x10 && (local_88 != 0 && (int)uVar8 <= (int)uVar17)) {
    pcVar14 = ppToken->name + (uVar10 & 0xffffffff);
    lVar15 = 0;
    do {
      lVar15 = (long)*pcVar14 + lVar15 * 10 + -0x30;
      pcVar14 = pcVar14 + 1;
      uVar7 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar7;
    } while ((int)uVar7 < (int)uVar17);
  }
  else {
    lVar15 = 0;
  }
  local_8c = len - uVar17;
  if (ch == 0x2e) {
    if (len < 0x401) {
      lVar11 = (long)len;
      len = len + 1;
      ppToken->name[lVar11] = '.';
    }
    ch = (*(this->inputStack).
           super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
    local_58 = this;
    uVar7 = len;
    if ((ch == 0x23) &&
       ((0 < this->ifdepth ||
        (ch = 0x23,
        ((this->parseContext->super_TParseVersions).intermediate)->source == EShSourceHlsl)))) {
      ch = 0x23;
      pcVar14 = "unexpected use of";
      if (len < 2) {
LAB_0040374b:
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,ppToken,pcVar14,"#","");
        goto joined_r0x00403780;
      }
      if (len != 3) {
        if ((len != 2) || (ppToken->name[0] == '1')) goto LAB_00403679;
        goto LAB_0040374b;
      }
      if (ppToken->name[1] == '1') {
LAB_00403679:
        if (3 < len) goto LAB_0040374b;
      }
      else if (ppToken->name[0] != '+') {
        if (ppToken->name[0] != '-') goto LAB_0040374b;
        goto LAB_00403679;
      }
      ch = (*(this->inputStack).
             super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
      pcVar14 = "expected \'INF\'";
      if (ch != 0x49) goto LAB_0040374b;
      ch = (*(this->inputStack).
             super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
      if ((ch != 0x4e) ||
         (ch = (*(this->inputStack).
                 super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])(), ch != 0x46)) {
        pcVar14 = "expected \'INF\'";
        goto LAB_0040374b;
      }
      if (len < 0x401) {
        uVar10 = (ulong)(uint)len;
        len = len + 1;
        ppToken->name[uVar10] = 'I';
      }
      if (len < 0x401) {
        lVar11 = (long)len;
        len = len + 1;
        ppToken->name[lVar11] = 'N';
      }
      if (len < 0x401) {
        lVar11 = (long)len;
        len = len + 1;
        ppToken->name[lVar11] = 'F';
      }
      ppToken->name[len] = '\0';
      if (ppToken->name[0] == '-') {
        lVar12 = -0x10000000000000;
      }
      else {
        lVar12 = 0x7ff0000000000000;
      }
      (ppToken->field_3).i64val = lVar12;
      ch = 0x46;
      bVar21 = false;
      uVar8 = len;
    }
    else {
joined_r0x00403780:
      while (uVar8 = uVar7, uVar16 = uVar7, ch == 0x30) {
        if ((int)uVar7 < 0x401) {
          lVar11 = (long)(int)uVar7;
          uVar7 = uVar7 + 1;
          ppToken->name[lVar11] = '0';
        }
        ch = (*(this->inputStack).
               super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
      }
      while (ch - 0x30U < 10) {
        if ((int)uVar8 < 0x401) {
          lVar11 = (long)(int)uVar8;
          uVar8 = uVar8 + 1;
          ppToken->name[lVar11] = (char)ch;
        }
        if (ch != 0x30) {
          uVar16 = uVar8;
        }
        ch = (*(local_58->inputStack).
               super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
      }
      bVar21 = true;
      if ((int)uVar7 < (int)uVar16) {
        local_88 = local_88 + ~uVar17 + uVar16;
        bVar6 = local_88 < 0x10 && bVar6;
        if (((int)uVar17 < (int)uVar16) && (bVar6)) {
          lVar11 = (long)(int)uVar17;
          do {
            if ((long)ppToken->name[lVar11] != 0x2e) {
              lVar15 = (long)ppToken->name[lVar11] + -0x30 + lVar15 * 10;
            }
            lVar11 = lVar11 + 1;
          } while ((int)uVar16 != lVar11);
        }
        local_8c = len - uVar16;
      }
    }
    len = uVar8;
    bVar5 = true;
    this = local_58;
    if (!bVar21) {
      return 0x9e;
    }
  }
  else {
    bVar5 = false;
  }
  bVar21 = false;
  if ((ch & 0xffffffdfU) == 0x45) {
    if (len < 0x401) {
      lVar11 = (long)len;
      len = len + 1;
      ppToken->name[lVar11] = (char)ch;
    }
    ch = (*(this->inputStack).
           super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
    if ((ch == 0x2d) || (ch == 0x2b)) {
      bVar21 = ch == 0x2d;
      if (len < 0x401) {
        lVar11 = (long)len;
        len = len + 1;
        ppToken->name[lVar11] = (char)ch;
      }
      ch = (*(this->inputStack).
             super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
    }
    else {
      bVar21 = false;
    }
    uVar7 = ch - 0x30;
    if (uVar7 < 10) {
      if (uVar7 < 10) {
        iVar19 = 0;
        do {
          iVar18 = uVar7 + iVar19 * 10;
          if (499 < iVar19) {
            iVar18 = iVar19;
          }
          if (len < 0x401) {
            lVar11 = (long)len;
            len = len + 1;
            ppToken->name[lVar11] = (char)ch;
          }
          ch = (*(this->inputStack).
                 super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
          uVar7 = ch - 0x30;
          iVar19 = iVar18;
        } while (uVar7 < 10);
        bVar5 = true;
        goto LAB_004039c5;
      }
    }
    else {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"bad character in float exponent");
    }
    iVar18 = 0;
    bVar5 = true;
  }
  else {
    iVar18 = 0;
  }
LAB_004039c5:
  if (bVar21) {
    uVar7 = iVar18 - local_8c;
  }
  else {
    uVar7 = iVar18 + local_8c;
    bVar21 = (int)uVar7 < 0;
    if ((int)uVar7 < 1) {
      uVar7 = -uVar7;
    }
  }
  bVar6 = (bool)((int)uVar7 < 0x17 & bVar6);
  dVar26 = 0.0;
  if ((bVar6) && (dVar26 = 1.0, 0 < (int)uVar7)) {
    dVar22 = 10.0;
    do {
      if ((uVar7 & 1) != 0) {
        dVar26 = dVar26 * dVar22;
      }
      dVar22 = dVar22 * dVar22;
      bVar4 = 1 < uVar7;
      uVar7 = uVar7 >> 1;
    } while (bVar4);
    uVar7 = 0;
  }
  uVar8 = ch & 0xffffffdf;
  cVar20 = (char)ch;
  if (uVar8 == 0x46) {
    if (this->ifdepth == 0) {
      TParseVersions::profileRequires
                (&this->parseContext->super_TParseVersions,&ppToken->loc,8,300,(char *)0x0,
                 "floating-point suffix");
    }
    if ((this->ifdepth == 0) &&
       (((this->parseContext->super_TParseVersions).messages & EShMsgRelaxedErrors) == EShMsgDefault
       )) {
      TParseVersions::profileRequires
                (&this->parseContext->super_TParseVersions,&ppToken->loc,-9,0x78,(char *)0x0,
                 "floating-point suffix");
    }
    if ((this->ifdepth == 0) && (!bVar5)) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"float literal needs a decimal point or exponent","","")
      ;
    }
    local_a4 = 0x9e;
  }
  else {
    if (uVar8 != 0x48) {
      if (uVar8 == 0x4c) {
        if ((this->ifdepth == 0) &&
           (pTVar3 = this->parseContext,
           ((pTVar3->super_TParseVersions).intermediate)->source == EShSourceGlsl)) {
          (*(pTVar3->super_TParseVersions)._vptr_TParseVersions[0x11])
                    (pTVar3,ppToken,"double floating-point suffix");
        }
        if ((this->ifdepth == 0) && (!bVar5)) {
          (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                    (this->parseContext,ppToken,"float literal needs a decimal point or exponent",""
                     ,"");
        }
        EVar2 = ((this->parseContext->super_TParseVersions).intermediate)->source;
        if (EVar2 == EShSourceHlsl) {
          local_a4 = 0x9f;
          if (len < 0x401) {
            lVar11 = (long)len;
            len = len + 1;
            ppToken->name[lVar11] = cVar20;
          }
          goto LAB_00403dd1;
        }
        if (EVar2 == EShSourceGlsl) {
          uVar8 = (*(this->inputStack).
                    super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
          if ((uVar8 & 0xffffffdf) != 0x46) goto LAB_00403da1;
          if (len < 0x401) {
            lVar11 = (long)len;
            len = len + 1;
            ppToken->name[lVar11] = cVar20;
          }
          local_a4 = 0x9f;
          goto LAB_00403c59;
        }
      }
      else {
        (*(this->inputStack).
          super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[4])();
      }
      local_a4 = 0x9e;
      goto LAB_00403dd1;
    }
    if ((this->ifdepth == 0) &&
       (pTVar3 = this->parseContext,
       ((pTVar3->super_TParseVersions).intermediate)->source == EShSourceGlsl)) {
      (*(pTVar3->super_TParseVersions)._vptr_TParseVersions[0x12])
                (pTVar3,ppToken,"half floating-point suffix",0);
    }
    if ((this->ifdepth == 0) && (!bVar5)) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"float literal needs a decimal point or exponent","","")
      ;
    }
    EVar2 = ((this->parseContext->super_TParseVersions).intermediate)->source;
    if (EVar2 != EShSourceHlsl) {
      local_a4 = 0x9e;
      if (EVar2 != EShSourceGlsl) goto LAB_00403dd1;
      uVar8 = (*(this->inputStack).
                super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
      if ((uVar8 & 0xffffffdf) != 0x46) {
LAB_00403da1:
        local_a4 = 0x9e;
        (*(this->inputStack).
          super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[4])();
        (*(this->inputStack).
          super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[4])();
        goto LAB_00403dd1;
      }
      if (len < 0x401) {
        lVar11 = (long)len;
        len = len + 1;
        ppToken->name[lVar11] = cVar20;
      }
      local_a4 = 0xa0;
LAB_00403c59:
      if (len < 0x401) {
        lVar11 = (long)len;
        len = len + 1;
        ppToken->name[lVar11] = (char)uVar8;
      }
      goto LAB_00403dd1;
    }
    local_a4 = 0xa0;
  }
  if (len < 0x401) {
    lVar11 = (long)len;
    len = len + 1;
    ppToken->name[lVar11] = cVar20;
  }
LAB_00403dd1:
  if (0x400 < len) {
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (this->parseContext,ppToken,"float literal too long","","");
    len = 0x400;
  }
  ppToken->name[len] = '\0';
  if (bVar6) {
    uVar24 = (undefined4)((ulong)lVar15 >> 0x20);
    if ((dVar26 != 0.0) || (NAN(dVar26))) {
      auVar25._8_4_ = uVar24;
      auVar25._0_8_ = lVar15;
      auVar25._12_4_ = 0x45300000;
      dVar22 = (auVar25._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0);
      if (bVar21) {
        (ppToken->field_3).dval = dVar22 / dVar26;
      }
      else {
        (ppToken->field_3).dval = dVar26 * dVar22;
      }
    }
    else {
      auVar23._8_4_ = uVar24;
      auVar23._0_8_ = lVar15;
      auVar23._12_4_ = 0x45300000;
      (ppToken->field_3).dval =
           (auVar23._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0);
    }
  }
  else {
    pcVar14 = ppToken->name;
    (ppToken->field_3).dval = 0.0;
    local_80 = GetThreadPoolAllocator();
    local_78 = local_68;
    sVar13 = strlen(pcVar14);
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_80,
               pcVar14,pcVar14 + sVar13);
    if ((byte)(local_78[local_70 + -1] | 0x20U) == 0x66) {
      local_78[local_70 + -1] = '\0';
      local_70 = local_70 + -1;
    }
    if ((byte)(local_78[local_70 + -1] | 0x20U) == 0x68) {
      local_78[local_70 + -1] = '\0';
      local_70 = local_70 + -1;
    }
    if ((byte)(local_78[local_70 + -1] | 0x20U) == 0x6c) {
      local_78[local_70 + -1] = '\0';
      local_70 = local_70 + -1;
    }
    piVar1 = &this->strtodStream;
    std::ios::clear((int)*(undefined8 *)(*(long *)&this->strtodStream + -0x18) + (int)piVar1);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,local_78,&local_81);
    std::__cxx11::stringbuf::str((string *)&this->field_0x258);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    std::istream::_M_extract<double>((double *)piVar1);
    if (((&this->field_0x268)[*(long *)(*(long *)piVar1 + -0x18)] & 5) != 0) {
      if ((!bVar21) && (300 < (int)(uVar7 + local_88))) {
        (ppToken->field_3).i64val = 0x7ff0000000000000;
      }
      if ((bVar21) && (300 < (int)(uVar7 + local_88))) {
        (ppToken->field_3).dval = 0.0;
      }
    }
  }
  return local_a4;
}

Assistant:

int TPpContext::lFloatConst(int len, int ch, TPpToken* ppToken)
{
    const auto saveName = [&](int ch) {
        if (len <= MaxTokenLength)
            ppToken->name[len++] = static_cast<char>(ch);
    };

    // find the range of non-zero digits before the decimal point
    int startNonZero = 0;
    while (startNonZero < len && ppToken->name[startNonZero] == '0')
        ++startNonZero;
    int endNonZero = len;
    while (endNonZero > startNonZero && ppToken->name[endNonZero-1] == '0')
        --endNonZero;
    int numWholeNumberDigits = endNonZero - startNonZero;

    // accumulate the range's value
    bool fastPath = numWholeNumberDigits <= 15;  // when the number gets too complex, set to false
    unsigned long long wholeNumber = 0;
    if (fastPath) {
        for (int i = startNonZero; i < endNonZero; ++i)
            wholeNumber = wholeNumber * 10 + (ppToken->name[i] - '0');
    }
    int decimalShift = len - endNonZero;

    // Decimal point:
    bool hasDecimalOrExponent = false;
    if (ch == '.') {
        hasDecimalOrExponent = true;
        saveName(ch);
        ch = getChar();
        int firstDecimal = len;

#ifdef ENABLE_HLSL
        // 1.#INF or -1.#INF
        if (ch == '#' && (ifdepth > 0 || parseContext.intermediate.getSource() == EShSourceHlsl)) {
            if ((len <  2) ||
                (len == 2 && ppToken->name[0] != '1') ||
                (len == 3 && ppToken->name[1] != '1' && !(ppToken->name[0] == '-' || ppToken->name[0] == '+')) ||
                (len >  3))
                parseContext.ppError(ppToken->loc, "unexpected use of", "#", "");
            else {
                // we have 1.# or -1.# or +1.#, check for 'INF'
                if ((ch = getChar()) != 'I' ||
                    (ch = getChar()) != 'N' ||
                    (ch = getChar()) != 'F')
                    parseContext.ppError(ppToken->loc, "expected 'INF'", "#", "");
                else {
                    // we have [+-].#INF, and we are targeting IEEE 754, so wrap it up:
                    saveName('I');
                    saveName('N');
                    saveName('F');
                    ppToken->name[len] = '\0';
                    if (ppToken->name[0] == '-')
                        ppToken->i64val = 0xfff0000000000000; // -Infinity
                    else
                        ppToken->i64val = 0x7ff0000000000000; // +Infinity
                    return PpAtomConstFloat;
                }
            }
        }
#endif

        // Consume leading-zero digits after the decimal point
        while (ch == '0') {
            saveName(ch);
            ch = getChar();
        }
        int startNonZeroDecimal = len;
        int endNonZeroDecimal = len;

        // Consume remaining digits, up to the exponent
        while (ch >= '0' && ch <= '9') {
            saveName(ch);
            if (ch != '0')
                endNonZeroDecimal = len;
            ch = getChar();
        }

        // Compute accumulation up to the last non-zero digit
        if (endNonZeroDecimal > startNonZeroDecimal) {
            numWholeNumberDigits += endNonZeroDecimal - endNonZero - 1; // don't include the "."
            if (numWholeNumberDigits > 15)
                fastPath = false;
            if (fastPath) {
                for (int i = endNonZero; i < endNonZeroDecimal; ++i) {
                    if (ppToken->name[i] != '.')
                        wholeNumber = wholeNumber * 10 + (ppToken->name[i] - '0');
                }
            }
            decimalShift = firstDecimal - endNonZeroDecimal;
        }
    }

    // Exponent:
    bool negativeExponent = false;
    double exponentValue = 0.0;
    int exponent = 0;
    {
        if (ch == 'e' || ch == 'E') {
            hasDecimalOrExponent = true;
            saveName(ch);
            ch = getChar();
            if (ch == '+' || ch == '-') {
                negativeExponent = ch == '-';
                saveName(ch);
                ch = getChar();
            }
            if (ch >= '0' && ch <= '9') {
                while (ch >= '0' && ch <= '9') {
                    if (exponent < 500) {
                        exponent = exponent * 10 + (ch - '0');
                    }
                    saveName(ch);
                    ch = getChar();
                }
            } else {
                parseContext.ppError(ppToken->loc, "bad character in float exponent", "", "");
            }
        }

        // Compensate for location of decimal
        if (negativeExponent)
            exponent -= decimalShift;
        else {
            exponent += decimalShift;
            if (exponent < 0) {
                negativeExponent = true;
                exponent = -exponent;
            }
        }
        if (exponent > 22)
            fastPath = false;

        if (fastPath) {
            // Compute the floating-point value of the exponent
            exponentValue = 1.0;
            if (exponent > 0) {
                double expFactor = 10;
                while (exponent > 0) {
                    if (exponent & 0x1)
                        exponentValue *= expFactor;
                    expFactor *= expFactor;
                    exponent >>= 1;
                }
            }
        }
    }

    // Suffix:
    bool isDouble = false;
    bool isFloat16 = false;
    if (ch == 'l' || ch == 'L') {
        if (ifdepth == 0 && parseContext.intermediate.getSource() == EShSourceGlsl)
            parseContext.doubleCheck(ppToken->loc, "double floating-point suffix");
        if (ifdepth == 0 && !hasDecimalOrExponent)
            parseContext.ppError(ppToken->loc, "float literal needs a decimal point or exponent", "", "");
        if (parseContext.intermediate.getSource() == EShSourceGlsl) {
            int ch2 = getChar();
            if (ch2 != 'f' && ch2 != 'F') {
                ungetChar();
                ungetChar();
            } else {
                saveName(ch);
                saveName(ch2);
                isDouble = true;
            }
        } else if (parseContext.intermediate.getSource() == EShSourceHlsl) {
            saveName(ch);
            isDouble = true;
        }
    } else if (ch == 'h' || ch == 'H') {
        if (ifdepth == 0 && parseContext.intermediate.getSource() == EShSourceGlsl)
            parseContext.float16Check(ppToken->loc, "half floating-point suffix");
        if (ifdepth == 0 && !hasDecimalOrExponent)
            parseContext.ppError(ppToken->loc, "float literal needs a decimal point or exponent", "", "");
        if (parseContext.intermediate.getSource() == EShSourceGlsl) {
            int ch2 = getChar();
            if (ch2 != 'f' && ch2 != 'F') {
                ungetChar();
                ungetChar();
            } else {
                saveName(ch);
                saveName(ch2);
                isFloat16 = true;
            }
        } else if (parseContext.intermediate.getSource() == EShSourceHlsl) {
            saveName(ch);
            isFloat16 = true;
        }
    } else
    if (ch == 'f' || ch == 'F') {
        if (ifdepth == 0)
            parseContext.profileRequires(ppToken->loc,  EEsProfile, 300, nullptr, "floating-point suffix");
        if (ifdepth == 0 && !parseContext.relaxedErrors())
            parseContext.profileRequires(ppToken->loc, ~EEsProfile, 120, nullptr, "floating-point suffix");
        if (ifdepth == 0 && !hasDecimalOrExponent)
            parseContext.ppError(ppToken->loc, "float literal needs a decimal point or exponent", "", "");
        saveName(ch);
    } else
        ungetChar();

    // Patch up the name and length for overflow

    if (len > MaxTokenLength) {
        len = MaxTokenLength;
        parseContext.ppError(ppToken->loc, "float literal too long", "", "");
    }
    ppToken->name[len] = '\0';

    // Compute the numerical value
    if (fastPath) {
        // compute the floating-point value of the exponent
        if (exponentValue == 0.0)
            ppToken->dval = (double)wholeNumber;
        else if (negativeExponent)
            ppToken->dval = (double)wholeNumber / exponentValue;
        else
            ppToken->dval = (double)wholeNumber * exponentValue;
    } else {
        // slow path
        ppToken->dval = 0.0;

        // remove suffix
        TString numstr(ppToken->name);
        if (numstr.back() == 'f' || numstr.back() == 'F')
            numstr.pop_back();
        if (numstr.back() == 'h' || numstr.back() == 'H')
            numstr.pop_back();
        if (numstr.back() == 'l' || numstr.back() == 'L')
            numstr.pop_back();

        // use platform library
        strtodStream.clear();
        strtodStream.str(numstr.c_str());
        strtodStream >> ppToken->dval;
        if (strtodStream.fail()) {
            // Assume failure combined with a large exponent was overflow, in
            // an attempt to set INF.
            if (!negativeExponent && exponent + numWholeNumberDigits > 300)
                ppToken->i64val = 0x7ff0000000000000; // +Infinity
            // Assume failure combined with a small exponent was overflow.
            if (negativeExponent && exponent + numWholeNumberDigits > 300)
                ppToken->dval = 0.0;
            // Unknown reason for failure. Theory is that either
            //  - the 0.0 is still there, or
            //  - something reasonable was written that is better than 0.0
        }
    }

    // Return the right token type
    if (isDouble)
        return PpAtomConstDouble;
    else if (isFloat16)
        return PpAtomConstFloat16;
    else
        return PpAtomConstFloat;
}